

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeLargerSig
                   (uint16_t abssrc,uint16_t npow2,uint16_t mask,float errTol,float srcFloat,
                   int doprint)

{
  ushort uVar1;
  ushort src;
  int iVar2;
  int iVar3;
  int in_ECX;
  ushort in_DX;
  ushort in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float in_XMM1_Da;
  int srcbits;
  float delta1;
  float delta;
  int bits1;
  int bits0;
  uint16_t alt1;
  uint16_t alt0;
  uint16_t mask2;
  ushort local_3a;
  
  uVar1 = in_DX ^ (in_SI | (ushort)((int)(uint)in_SI >> 1));
  local_3a = in_DI & uVar1;
  src = in_DI + in_SI & in_DX;
  if (in_ECX != 0) {
    printf("  mask2  0x%04X %016b\n",(ulong)uVar1,(ulong)uVar1);
    printf("  test0  0x%04X %016b\n",(ulong)local_3a,(ulong)local_3a);
    printf("  test1  0x%04X %016b\n",(ulong)src,(ulong)src);
  }
  iVar2 = countSetBits(local_3a);
  iVar3 = countSetBits(src);
  if (iVar3 < iVar2) {
    fVar4 = imath_half_to_float(src);
    if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
      return src;
    }
    fVar5 = imath_half_to_float(local_3a);
    fVar5 = in_XMM1_Da - fVar5;
    src = local_3a;
  }
  else if (iVar3 == iVar2) {
    fVar4 = imath_half_to_float(local_3a);
    fVar5 = imath_half_to_float(src);
    fVar5 = fVar5 - in_XMM1_Da;
    if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
      if (fVar5 < in_XMM1_Da - fVar4) {
        local_3a = src;
      }
      return local_3a;
    }
  }
  else {
    fVar4 = imath_half_to_float(local_3a);
    if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
      return local_3a;
    }
    iVar2 = countSetBits(in_DI);
    if (iVar2 <= iVar3) {
      return in_DI;
    }
    fVar5 = imath_half_to_float(src);
    fVar5 = fVar5 - in_XMM1_Da;
  }
  if (in_XMM0_Da <= fVar5) {
    return in_DI;
  }
  return src;
}

Assistant:

static inline uint16_t handleQuantizeLargerSig (
    uint16_t abssrc, uint16_t npow2, uint16_t mask, float errTol, float srcFloat, int doprint)
{
    // in this case, only need to test two scenarios:
    //
    // can't fully zero out the masked region, so go to "0.5" of that
    // region and then test the rounded value...
    const uint16_t mask2 = (mask ^ (npow2 | (npow2 >> 1)));

    uint16_t alt0 = (abssrc & mask2);
    uint16_t alt1 = ((abssrc + npow2) & mask);

    if (doprint)
    {
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  test0  0x%04X %016b\n", alt0, alt0);
        printf ("  test1  0x%04X %016b\n", alt1, alt1);
    }

    int bits0 = countSetBits (alt0);
    int bits1 = countSetBits (alt1);

    float delta;

    if (bits1 < bits0)
    {
        delta = imath_half_to_float(alt1) - srcFloat; // alt1 >= srcFloat
        // bits1 < bits0 and if ok, just return
        if (delta < errTol)
            return alt1;
        delta = srcFloat - imath_half_to_float(alt0); // alt0 <= srcFloat
        if (delta < errTol)
            return alt0;
    }
    else if (bits1 == bits0)
    {
        delta = srcFloat - imath_half_to_float(alt0);
        float delta1 = imath_half_to_float(alt1) - srcFloat;
        if (delta < errTol)
            return (delta1 < delta) ? alt1 : alt0;

        if (delta1 < errTol)
            return alt1;
    }
    else
    {
        delta = srcFloat - imath_half_to_float(alt0);
        // bits0 < bits1 so if ok, just return
        if (delta < errTol)
            return alt0;

        // fallback...
        // in this case, alt1 rounding could have made
        // bits1 larger than src, test for that
        int srcbits = countSetBits (abssrc);
        if (bits1 < srcbits)
        {
            delta = imath_half_to_float(alt1) - srcFloat;
            if (delta < errTol)
                return alt1;
        }
    }
    return abssrc;
}